

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O3

int alpn_select_proto_cb(SSL *ssl,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  int iVar1;
  
  iVar1 = nghttp2_select_alpn(out,outlen,in,inlen);
  return (uint)(iVar1 != 1) * 3;
}

Assistant:

static int alpn_select_proto_cb(SSL *ssl, const unsigned char **out,
                                unsigned char *outlen, const unsigned char *in,
                                unsigned int inlen, void *arg) {
  int rv;
  (void)ssl;
  (void)arg;

  rv = nghttp2_select_alpn(out, outlen, in, inlen);

  if (rv != 1) {
    return SSL_TLSEXT_ERR_NOACK;
  }

  return SSL_TLSEXT_ERR_OK;
}